

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmintegration.cpp
# Opt level: O0

EGLDisplay __thiscall
QEglFSKmsGbmIntegration::createDisplay
          (QEglFSKmsGbmIntegration *this,EGLNativeDisplayType nativeDisplay)

{
  bool bVar1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_00;
  char *pcVar2;
  EGLDisplay pvVar3;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  char *extensions;
  PFNEGLGETPLATFORMDISPLAYEXTPROC getPlatformDisplay;
  EGLDisplay display;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  code *file;
  QMessageLogger *in_stack_ffffffffffffff80;
  QMessageLogger *this_01;
  char local_68 [32];
  char local_48 [32];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcEglfsKmsDebug();
  anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1197d9);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(char *)in_stack_ffffffffffffff68,
               (char *)0x1197ef);
    QMessageLogger::debug(local_48,"Querying EGLDisplay");
    local_10 = 0;
  }
  this_01 = (QMessageLogger *)0xaaaaaaaaaaaaaaaa;
  file = (code *)0x0;
  this_00 = (QLoggingCategoryMacroHolder<(QtMsgType)0> *)eglQueryString(0,0x3055);
  if (this_00 != (QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x0) {
    pcVar2 = strstr((char *)this_00,"EGL_KHR_platform_gbm");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr((char *)this_00,"EGL_MESA_platform_gbm");
      if (pcVar2 == (char *)0x0) goto LAB_0011987e;
    }
    file = (code *)eglGetProcAddress("eglGetPlatformDisplayEXT");
  }
LAB_0011987e:
  if (file == (code *)0x0) {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEglfsKmsDebug();
    anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (this_00,in_stack_ffffffffffffff68);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_28);
      if (!bVar1) break;
      anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1198e9);
      QMessageLogger::QMessageLogger
                (this_01,(char *)file,(int)((ulong)this_00 >> 0x20),
                 (char *)in_stack_ffffffffffffff68,(char *)0x1198ff);
      QMessageLogger::debug
                (local_68,"No eglGetPlatformDisplay for GBM, falling back to eglGetDisplay");
      local_20 = local_20 & 0xffffffffffffff00;
    }
    pvVar3 = (EGLDisplay)eglGetDisplay(in_RSI);
  }
  else {
    pvVar3 = (EGLDisplay)(*file)(0x31d7,in_RSI,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

EGLDisplay QEglFSKmsGbmIntegration::createDisplay(EGLNativeDisplayType nativeDisplay)
{
    qCDebug(qLcEglfsKmsDebug, "Querying EGLDisplay");
    EGLDisplay display;

    PFNEGLGETPLATFORMDISPLAYEXTPROC getPlatformDisplay = nullptr;
    const char *extensions = eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS);
    if (extensions && (strstr(extensions, "EGL_KHR_platform_gbm") || strstr(extensions, "EGL_MESA_platform_gbm"))) {
        getPlatformDisplay = reinterpret_cast<PFNEGLGETPLATFORMDISPLAYEXTPROC>(
            eglGetProcAddress("eglGetPlatformDisplayEXT"));
    }

    if (getPlatformDisplay) {
        display = getPlatformDisplay(EGL_PLATFORM_GBM_KHR, nativeDisplay, nullptr);
    } else {
        qCDebug(qLcEglfsKmsDebug, "No eglGetPlatformDisplay for GBM, falling back to eglGetDisplay");
        display = eglGetDisplay(nativeDisplay);
    }

    return display;
}